

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashList_AddKVPair(ktxHashList *pHead,char *key,uint valueLen,void *value)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  uint *puVar9;
  void *pvVar10;
  long lVar11;
  long *plVar12;
  void *in_RCX;
  uint in_EDX;
  char *in_RSI;
  long *in_RDI;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  char *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _ha_bkt;
  ktxKVListEntry *kv;
  uint keyLen;
  int local_84;
  long local_60;
  uint local_58;
  char *local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  ktx_error_code_e local_4;
  
  if (((in_RDI == (long *)0x0) || (in_RSI == (char *)0x0)) ||
     ((in_EDX != 0 && (in_RCX == (void *)0x0)))) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    sVar8 = strlen(in_RSI);
    uVar5 = (int)sVar8 + 1;
    if (uVar5 == 1) {
      local_4 = KTX_INVALID_VALUE;
    }
    else {
      puVar9 = (uint *)malloc((ulong)uVar5 + 0x58 + (ulong)in_EDX);
      *(uint **)(puVar9 + 2) = puVar9 + 0x16;
      *puVar9 = uVar5;
      memcpy(*(void **)(puVar9 + 2),in_RSI,(ulong)uVar5);
      puVar9[4] = in_EDX;
      if (in_EDX == 0) {
        puVar9[6] = 0;
        puVar9[7] = 0;
      }
      else {
        *(ulong *)(puVar9 + 6) = *(long *)(puVar9 + 2) + (ulong)uVar5;
        memcpy(*(void **)(puVar9 + 6),in_RCX,(ulong)in_EDX);
      }
      puVar9[0xc] = 0;
      puVar9[0xd] = 0;
      *(undefined8 *)(puVar9 + 0x12) = *(undefined8 *)(puVar9 + 2);
      puVar9[0x14] = *puVar9 - 1;
      if (*in_RDI == 0) {
        *in_RDI = (long)puVar9;
        *(undefined8 *)(*in_RDI + 0x28) = 0;
        pvVar10 = malloc(0x40);
        *(void **)(*in_RDI + 0x20) = pvVar10;
        if (*(long *)(*in_RDI + 0x20) == 0) {
          exit(-1);
        }
        memset(*(void **)(*in_RDI + 0x20),0,0x40);
        *(long *)(*(long *)(*in_RDI + 0x20) + 0x18) = *in_RDI + 0x20;
        *(undefined4 *)(*(long *)(*in_RDI + 0x20) + 8) = 0x20;
        *(undefined4 *)(*(long *)(*in_RDI + 0x20) + 0xc) = 5;
        *(long *)(*(long *)(*in_RDI + 0x20) + 0x20) = (*in_RDI + 0x20) - *in_RDI;
        pvVar10 = malloc(0x200);
        **(undefined8 **)(*in_RDI + 0x20) = pvVar10;
        if (**(long **)(*in_RDI + 0x20) == 0) {
          exit(-1);
        }
        memset((void *)**(undefined8 **)(*in_RDI + 0x20),0,0x200);
        *(undefined4 *)(*(long *)(*in_RDI + 0x20) + 0x38) = 0xa0111fe1;
      }
      else {
        *(uint **)(*(long *)(*(long *)(*in_RDI + 0x20) + 0x18) + 0x10) = puVar9;
        *(long *)(puVar9 + 10) =
             *(long *)(*(long *)(*in_RDI + 0x20) + 0x18) -
             *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
        *(uint **)(*(long *)(*in_RDI + 0x20) + 0x18) = puVar9 + 8;
      }
      *(int *)(*(long *)(*in_RDI + 0x20) + 0x10) = *(int *)(*(long *)(*in_RDI + 0x20) + 0x10) + 1;
      *(undefined8 *)(puVar9 + 8) = *(undefined8 *)(*in_RDI + 0x20);
      local_50 = *(char **)(puVar9 + 2);
      puVar9[0x15] = 0xfeedbeef;
      local_44 = 0x9e3779b9;
      local_40 = 0x9e3779b9;
      for (local_48 = *puVar9 - 1; 0xb < local_48; local_48 = local_48 - 0xc) {
        cVar1 = *local_50;
        cVar2 = local_50[1];
        cVar3 = local_50[2];
        cVar4 = local_50[3];
        iVar6 = (int)local_50[4] + local_50[5] * 0x100 + local_50[6] * 0x10000 +
                local_50[7] * 0x1000000 + local_44;
        puVar9[0x15] = (int)local_50[8] + local_50[9] * 0x100 + local_50[10] * 0x10000 +
                       local_50[0xb] * 0x1000000 + puVar9[0x15];
        uVar5 = puVar9[0x15] >> 0xd ^
                (((int)cVar1 + cVar2 * 0x100 + cVar3 * 0x10000 + cVar4 * 0x1000000 + local_40) -
                iVar6) - puVar9[0x15];
        uVar7 = uVar5 << 8 ^ (iVar6 - puVar9[0x15]) - uVar5;
        puVar9[0x15] = puVar9[0x15] - uVar5;
        puVar9[0x15] = puVar9[0x15] - uVar7;
        puVar9[0x15] = uVar7 >> 0xd ^ puVar9[0x15];
        uVar5 = puVar9[0x15] >> 0xc ^ (uVar5 - uVar7) - puVar9[0x15];
        uVar7 = uVar5 << 0x10 ^ (uVar7 - puVar9[0x15]) - uVar5;
        puVar9[0x15] = puVar9[0x15] - uVar5;
        puVar9[0x15] = puVar9[0x15] - uVar7;
        puVar9[0x15] = uVar7 >> 5 ^ puVar9[0x15];
        local_40 = puVar9[0x15] >> 3 ^ (uVar5 - uVar7) - puVar9[0x15];
        local_44 = local_40 << 10 ^ (uVar7 - puVar9[0x15]) - local_40;
        puVar9[0x15] = puVar9[0x15] - local_40;
        puVar9[0x15] = puVar9[0x15] - local_44;
        puVar9[0x15] = local_44 >> 0xf ^ puVar9[0x15];
        local_50 = local_50 + 0xc;
      }
      puVar9[0x15] = (*puVar9 - 1) + puVar9[0x15];
      switch(local_48) {
      case 0xb:
        puVar9[0x15] = local_50[10] * 0x1000000 + puVar9[0x15];
      case 10:
        puVar9[0x15] = local_50[9] * 0x10000 + puVar9[0x15];
      case 9:
        puVar9[0x15] = local_50[8] * 0x100 + puVar9[0x15];
      case 8:
        local_44 = local_50[7] * 0x1000000 + local_44;
      case 7:
        local_44 = local_50[6] * 0x10000 + local_44;
      case 6:
        local_44 = local_50[5] * 0x100 + local_44;
      case 5:
        local_44 = (int)local_50[4] + local_44;
      case 4:
        local_40 = local_50[3] * 0x1000000 + local_40;
      case 3:
        local_40 = local_50[2] * 0x10000 + local_40;
      case 2:
        local_40 = local_50[1] * 0x100 + local_40;
      case 1:
        local_40 = (int)*local_50 + local_40;
      }
      uVar5 = puVar9[0x15] >> 0xd ^ (local_40 - local_44) - puVar9[0x15];
      uVar7 = uVar5 << 8 ^ (local_44 - puVar9[0x15]) - uVar5;
      puVar9[0x15] = puVar9[0x15] - uVar5;
      puVar9[0x15] = puVar9[0x15] - uVar7;
      puVar9[0x15] = uVar7 >> 0xd ^ puVar9[0x15];
      uVar5 = puVar9[0x15] >> 0xc ^ (uVar5 - uVar7) - puVar9[0x15];
      uVar7 = uVar5 << 0x10 ^ (uVar7 - puVar9[0x15]) - uVar5;
      puVar9[0x15] = puVar9[0x15] - uVar5;
      puVar9[0x15] = puVar9[0x15] - uVar7;
      puVar9[0x15] = uVar7 >> 5 ^ puVar9[0x15];
      uVar5 = puVar9[0x15] >> 3 ^ (uVar5 - uVar7) - puVar9[0x15];
      uVar7 = uVar5 << 10 ^ (uVar7 - puVar9[0x15]) - uVar5;
      puVar9[0x15] = puVar9[0x15] - uVar5;
      puVar9[0x15] = puVar9[0x15] - uVar7;
      puVar9[0x15] = uVar7 >> 0xf ^ puVar9[0x15];
      uVar5 = puVar9[0x15] & *(int *)(*(long *)(*in_RDI + 0x20) + 8) - 1U;
      lVar11 = **(long **)(*in_RDI + 0x20) + (ulong)uVar5 * 0x10;
      *(int *)(lVar11 + 8) = *(int *)(lVar11 + 8) + 1;
      *(undefined8 *)(puVar9 + 0x10) =
           *(undefined8 *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar5 * 0x10);
      puVar9[0xe] = 0;
      puVar9[0xf] = 0;
      if (*(long *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar5 * 0x10) != 0) {
        *(uint **)(*(long *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar5 * 0x10) + 0x18) = puVar9 + 8
        ;
      }
      *(uint **)(**(long **)(*in_RDI + 0x20) + (ulong)uVar5 * 0x10) = puVar9 + 8;
      if (((uint)((*(int *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar5 * 0x10 + 0xc) + 1) * 10) <=
           *(uint *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar5 * 0x10 + 8)) &&
         (*(int *)(*(long *)(puVar9 + 8) + 0x34) != 1)) {
        pvVar10 = malloc((ulong)(uint)(*(int *)(*(long *)(puVar9 + 8) + 8) << 1) << 4);
        if (pvVar10 == (void *)0x0) {
          exit(-1);
        }
        memset(pvVar10,0,(ulong)(uint)(*(int *)(*(long *)(puVar9 + 8) + 8) << 1) << 4);
        *(uint *)(*(long *)(puVar9 + 8) + 0x28) =
             (*(uint *)(*(long *)(puVar9 + 8) + 0x10) >>
             ((char)*(undefined4 *)(*(long *)(puVar9 + 8) + 0xc) + 1U & 0x1f)) +
             (uint)((*(uint *)(*(long *)(puVar9 + 8) + 0x10) &
                    *(int *)(*(long *)(puVar9 + 8) + 8) * 2 - 1U) != 0);
        *(undefined4 *)(*(long *)(puVar9 + 8) + 0x2c) = 0;
        for (local_58 = 0; local_58 < *(uint *)(*(long *)(puVar9 + 8) + 8); local_58 = local_58 + 1)
        {
          local_60 = *(long *)(**(long **)(puVar9 + 8) + (ulong)local_58 * 0x10);
          while (local_60 != 0) {
            lVar11 = *(long *)(local_60 + 0x20);
            plVar12 = (long *)((long)pvVar10 +
                              (ulong)(*(uint *)(local_60 + 0x34) &
                                     *(int *)(*(long *)(puVar9 + 8) + 8) * 2 - 1U) * 0x10);
            uVar5 = (int)plVar12[1] + 1;
            *(uint *)(plVar12 + 1) = uVar5;
            if (*(uint *)(*(long *)(puVar9 + 8) + 0x28) < uVar5) {
              *(int *)(*(long *)(puVar9 + 8) + 0x2c) = *(int *)(*(long *)(puVar9 + 8) + 0x2c) + 1;
              *(uint *)((long)plVar12 + 0xc) =
                   *(uint *)(plVar12 + 1) / *(uint *)(*(long *)(puVar9 + 8) + 0x28);
            }
            *(undefined8 *)(local_60 + 0x18) = 0;
            *(long *)(local_60 + 0x20) = *plVar12;
            if (*plVar12 != 0) {
              *(long *)(*plVar12 + 0x18) = local_60;
            }
            *plVar12 = local_60;
            local_60 = lVar11;
          }
        }
        *(int *)(*(long *)(puVar9 + 8) + 8) = *(int *)(*(long *)(puVar9 + 8) + 8) << 1;
        *(int *)(*(long *)(puVar9 + 8) + 0xc) = *(int *)(*(long *)(puVar9 + 8) + 0xc) + 1;
        free((void *)**(undefined8 **)(puVar9 + 8));
        **(undefined8 **)(puVar9 + 8) = pvVar10;
        if (*(uint *)(*(long *)(puVar9 + 8) + 0x10) >> 1 < *(uint *)(*(long *)(puVar9 + 8) + 0x2c))
        {
          local_84 = *(int *)(*(long *)(puVar9 + 8) + 0x30) + 1;
        }
        else {
          local_84 = 0;
        }
        *(int *)(*(long *)(puVar9 + 8) + 0x30) = local_84;
        if (1 < *(uint *)(*(long *)(puVar9 + 8) + 0x30)) {
          *(undefined4 *)(*(long *)(puVar9 + 8) + 0x34) = 1;
        }
      }
      local_4 = KTX_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashList_AddKVPair(ktxHashList* pHead, const char* key, unsigned int valueLen, const void* value)
{
    if (pHead && key && (valueLen == 0 || value)) {
        unsigned int keyLen = (unsigned int)strlen(key) + 1;
        ktxKVListEntry* kv;

        if (keyLen == 1)
            return KTX_INVALID_VALUE;   /* Empty string */

        /* Allocate all the memory as a block */
        kv = (ktxKVListEntry*)malloc(sizeof(ktxKVListEntry) + keyLen + valueLen);
        /* Put key first */
        kv->key = (char *)kv + sizeof(ktxKVListEntry);
        kv->keyLen = keyLen;
        memcpy(kv->key, key, keyLen);
        /* then value */
        kv->valueLen = valueLen;
        if (valueLen > 0) {
            kv->value = kv->key + keyLen;
            memcpy(kv->value, value, valueLen);
        } else {
            kv->value = 0;
        }

        HASH_ADD_KEYPTR( hh, *pHead, kv->key, kv->keyLen-1, kv);
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}